

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_conversion_to_int_array_with_runoptimize(void)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  uint32_t *a;
  long lVar3;
  uint64_t uVar4;
  uint32_t *ans;
  uint32_t i;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  
  prVar2 = roaring_bitmap_create();
  a = (uint32_t *)calloc(100000,4);
  uVar5 = 0;
  iVar7 = 0;
  do {
    if (uVar5 != 30000) {
      lVar3 = (long)iVar7;
      if (uVar5 == 50000) {
        iVar7 = iVar7 + 0xdca;
        uVar5 = 70000;
        for (; iVar7 != lVar3; lVar3 = lVar3 + 1) {
          a[lVar3] = uVar5;
          uVar5 = uVar5 + 0x11;
        }
        for (uVar6 = 0x30000; uVar6 != 0x40000; uVar6 = uVar6 + 1) {
          if ((uVar6 / 3) * 3 != uVar6) {
            lVar3 = (long)iVar7;
            iVar7 = iVar7 + 1;
            a[lVar3] = uVar6;
          }
        }
        roaring_bitmap_free(prVar2);
        prVar2 = make_roaring_from_array(a,iVar7);
        _Var1 = roaring_bitmap_run_optimize(prVar2);
        _assert_true((ulong)_Var1,"roaring_bitmap_run_optimize(r1)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                     ,0xa8e);
        uVar4 = roaring_bitmap_get_cardinality(prVar2);
        ans = (uint32_t *)malloc(uVar4 * 4);
        roaring_bitmap_to_uint32_array(prVar2,ans);
        uVar6 = array_equals(ans,(int32_t)uVar4,a,iVar7);
        _assert_true((ulong)uVar6,"array_equals(arr, (int)card, ans, ans_ctr)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                     ,0xa94);
        roaring_bitmap_free(prVar2);
        free(ans);
        free(a);
        return;
      }
      iVar7 = iVar7 + 1;
      a[lVar3] = uVar5;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

DEFINE_TEST(test_conversion_to_int_array_with_runoptimize) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    int ans_ctr = 0;
    uint32_t *ans = (uint32_t *)calloc(100000, sizeof(int32_t));

    // a dense bitmap container  (best done with runs)
    for (uint32_t i = 0; i < 50000; ++i) {
        if (i != 30000) {  // making 2 runs
            ans[ans_ctr++] = i;
        }
    }

    // a sparse one
    for (uint32_t i = 70000; i < 130000; i += 17) {
        ans[ans_ctr++] = i;
    }

    // a dense one but not good for runs

    for (uint32_t i = 65536 * 3; i < 65536 * 4; i++) {
        if (i % 3 != 0) {
            ans[ans_ctr++] = i;
        }
    }
    roaring_bitmap_free(r1);

    r1 = make_roaring_from_array(ans, ans_ctr);
    assert_true(roaring_bitmap_run_optimize(r1));

    uint64_t card = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr);

    assert_true(array_equals(arr, (int)card, ans, ans_ctr));
    roaring_bitmap_free(r1);
    free(arr);
    free(ans);
}